

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

String * kj::anon_unknown_36::generateWebSocketAccept(String *__return_storage_ptr__,StringPtr key)

{
  String *pSVar1;
  undefined1 in_R8B;
  byte digest [20];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  SHA1_CTX local_78;
  
  local_88 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_78.state[0] = 0x67452301;
  local_78.state[1] = 0xefcdab89;
  local_78.state[2] = 0x98badcfe;
  local_78.state[3] = 0x10325476;
  local_78.state[4] = 0xc3d2e1f0;
  local_78.count[0] = 0;
  local_78.count[1] = 0;
  SHA1Update(&local_78,(uchar *)key.content.ptr,(int)key.content.size_ - 1);
  SHA1Update(&local_78,(anonymous_namespace)::WEBSOCKET_GUID,0x24);
  SHA1Final((uchar *)&local_98,&local_78);
  pSVar1 = encodeBase64(__return_storage_ptr__,(kj *)&local_98,
                        (ArrayPtr<const_unsigned_char>)ZEXT816(0x14),(bool)in_R8B);
  return pSVar1;
}

Assistant:

static kj::String generateWebSocketAccept(kj::StringPtr key) {
  // WebSocket demands we do a SHA-1 here. ARRGHH WHY SHA-1 WHYYYYYY?
  SHA1_CTX ctx;
  byte digest[20]{};
  SHA1Init(&ctx);
  SHA1Update(&ctx, key.asBytes().begin(), key.size());
  SHA1Update(&ctx, reinterpret_cast<const byte*>(WEBSOCKET_GUID), strlen(WEBSOCKET_GUID));
  SHA1Final(digest, &ctx);
  return kj::encodeBase64(digest);
}